

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O1

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::finishCurr
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pHVar3;
  const_iterator cVar4;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->finished,
             (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  do {
    pHVar2 = (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar3 = (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pHVar1 = pHVar3 + -1;
    (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = pHVar1;
    if (pHVar2 == pHVar1) {
      return;
    }
    cVar4 = std::
            _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->finished)._M_h,pHVar3 + -2);
  } while (cVar4.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0);
  return;
}

Assistant:

void finishCurr() {
    finished.insert(workStack.back());
    workStack.pop_back();
    while (!workStack.empty() && finished.count(workStack.back())) {
      workStack.pop_back();
    }
  }